

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

void * secp256k1_scratch_alloc
                 (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t size)

{
  long lVar1;
  int iVar2;
  ulong __n;
  void *__s;
  
  __n = (size - 1 & 0xfffffffffffffff0) + 0x10;
  if (size <= __n) {
    lVar1 = 0;
    do {
      iVar2 = (uint)scratch->magic[lVar1] - (uint)(byte)"scratch"[lVar1];
      if (scratch->magic[lVar1] != "scratch"[lVar1]) goto LAB_0011fd33;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    iVar2 = 0;
LAB_0011fd33:
    if (iVar2 == 0) {
      if (__n <= scratch->max_size - scratch->alloc_size) {
        __s = (void *)(scratch->alloc_size + (long)scratch->data);
        memset(__s,0,__n);
        scratch->alloc_size = scratch->alloc_size + __n;
        return __s;
      }
    }
    else {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *secp256k1_scratch_alloc(const secp256k1_callback* error_callback, secp256k1_scratch* scratch, size_t size) {
    void *ret;
    size_t rounded_size;

    rounded_size = ROUND_TO_ALIGN(size);
    /* Check that rounding did not wrap around */
    if (rounded_size < size) {
        return NULL;
    }
    size = rounded_size;

    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return NULL;
    }

    if (size > scratch->max_size - scratch->alloc_size) {
        return NULL;
    }
    ret = (void *) ((char *) scratch->data + scratch->alloc_size);
    memset(ret, 0, size);
    scratch->alloc_size += size;

    return ret;
}